

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O1

bool __thiscall
slang::analysis::DataFlowAnalysis::isReferenced
          (DataFlowAnalysis *this,ValueSymbol *symbol,Expression *lsp)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  Type *rootType;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  SymbolLSPMap *this_00;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  optional<std::pair<unsigned_long,_unsigned_long>_> bounds;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_f0;
  char local_e0;
  char local_d8;
  char cStack_d7;
  char cStack_d6;
  char cStack_d5;
  char cStack_d4;
  char cStack_d3;
  char cStack_d2;
  char cStack_d1;
  char cStack_d0;
  char cStack_cf;
  char cStack_ce;
  char cStack_cd;
  char cStack_cc;
  char cStack_cb;
  char cStack_ca;
  char cStack_c9;
  const_iterator local_c0;
  overlap_iterator local_80;
  
  rootType = ast::DeclaredType::getType(&symbol->declaredType);
  ast::ValueDriver::getBounds
            ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_f0._M_value,lsp,
             &(this->
              super_AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
              ).super_FlowAnalysisBase.evalContext,rootType);
  if (local_e0 == '\0') {
    bVar6 = isReferenced(this,symbol);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = symbol;
    uVar12 = SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),8) ^
             SUB168(auVar5 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar7 = uVar12 >> ((this->symbolToSlot).field_0x50 & 0x3f);
    lVar8 = *(long *)&(this->symbolToSlot).field_0x60;
    lVar9 = (uVar12 & 0xff) * 4;
    cVar15 = (&UNK_009584ac)[lVar9];
    cVar16 = (&UNK_009584ad)[lVar9];
    cVar17 = (&UNK_009584ae)[lVar9];
    cVar18 = (&UNK_009584af)[lVar9];
    uVar2 = *(ulong *)&(this->symbolToSlot).field_0x58;
    uVar11 = 0;
    do {
      pcVar1 = (char *)(lVar8 + uVar7 * 0x10);
      auVar13[0] = -(*pcVar1 == cVar15);
      auVar13[1] = -(pcVar1[1] == cVar16);
      auVar13[2] = -(pcVar1[2] == cVar17);
      auVar13[3] = -(pcVar1[3] == cVar18);
      auVar13[4] = -(pcVar1[4] == cVar15);
      auVar13[5] = -(pcVar1[5] == cVar16);
      auVar13[6] = -(pcVar1[6] == cVar17);
      auVar13[7] = -(pcVar1[7] == cVar18);
      auVar13[8] = -(pcVar1[8] == cVar15);
      auVar13[9] = -(pcVar1[9] == cVar16);
      auVar13[10] = -(pcVar1[10] == cVar17);
      auVar13[0xb] = -(pcVar1[0xb] == cVar18);
      auVar13[0xc] = -(pcVar1[0xc] == cVar15);
      auVar13[0xd] = -(pcVar1[0xd] == cVar16);
      auVar13[0xe] = -(pcVar1[0xe] == cVar17);
      auVar13[0xf] = -(pcVar1[0xf] == cVar18);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar9 = *(long *)&(this->symbolToSlot).field_0x68 + uVar7 * 0xf0;
        do {
          iVar3 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar9 + (ulong)(uint)(iVar3 << 4)) == symbol) {
            lVar9 = (ulong)(uint)(iVar3 << 4) + lVar9;
            goto LAB_00631862;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if ((*(byte *)(uVar7 * 0x10 + lVar8 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
      lVar9 = uVar7 + uVar11;
      uVar11 = uVar11 + 1;
      uVar7 = lVar9 + 1U & uVar2;
    } while (uVar11 <= uVar2);
    lVar9 = 0;
LAB_00631862:
    cVar19 = cVar15;
    cVar20 = cVar16;
    cVar21 = cVar17;
    cVar22 = cVar18;
    cVar23 = cVar15;
    cVar24 = cVar16;
    cVar25 = cVar17;
    cVar26 = cVar18;
    cVar27 = cVar15;
    cVar28 = cVar16;
    cVar29 = cVar17;
    cVar30 = cVar18;
    if (lVar9 != 0) {
      this_00 = &(this->lvalues).
                 super_SmallVectorBase<slang::analysis::DataFlowAnalysis::LValueSymbol>.data_
                 [*(uint *)(lVar9 + 8)].assigned;
      local_d8 = cVar15;
      cStack_d7 = cVar16;
      cStack_d6 = cVar17;
      cStack_d5 = cVar18;
      cStack_d4 = cVar15;
      cStack_d3 = cVar16;
      cStack_d2 = cVar17;
      cStack_d1 = cVar18;
      cStack_d0 = cVar15;
      cStack_cf = cVar16;
      cStack_ce = cVar17;
      cStack_cd = cVar18;
      cStack_cc = cVar15;
      cStack_cb = cVar16;
      cStack_ca = cVar17;
      cStack_c9 = cVar18;
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::find
                (&local_80,this_00,local_f0._M_value.first,local_f0._M_value.second);
      IntervalMap<unsigned_long,_const_slang::ast::Expression_*,_5U>::end(&local_c0,this_00);
      bVar6 = IntervalMapDetails::Path::operator==
                        (&local_80.super_iterator.super_const_iterator.path,&local_c0.path);
      if (local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   firstElement) {
        operator_delete(local_c0.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      if (local_80.super_iterator.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)((long)&local_80.super_iterator.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18U)) {
        operator_delete(local_80.super_iterator.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      cVar15 = local_d8;
      cVar16 = cStack_d7;
      cVar17 = cStack_d6;
      cVar18 = cStack_d5;
      cVar19 = cStack_d4;
      cVar20 = cStack_d3;
      cVar21 = cStack_d2;
      cVar22 = cStack_d1;
      cVar23 = cStack_d0;
      cVar24 = cStack_cf;
      cVar25 = cStack_ce;
      cVar26 = cStack_cd;
      cVar27 = cStack_cc;
      cVar28 = cStack_cb;
      cVar29 = cStack_ca;
      cVar30 = cStack_c9;
      if (!bVar6) {
        return true;
      }
    }
    uVar7 = uVar12 >> ((this->rvalues).field_0x130 & 0x3f);
    lVar9 = *(long *)&(this->rvalues).field_0x140;
    uVar2 = *(ulong *)&(this->rvalues).field_0x138;
    uVar11 = 0;
    do {
      pcVar1 = (char *)(lVar9 + uVar7 * 0x10);
      auVar14[0] = -(*pcVar1 == cVar15);
      auVar14[1] = -(pcVar1[1] == cVar16);
      auVar14[2] = -(pcVar1[2] == cVar17);
      auVar14[3] = -(pcVar1[3] == cVar18);
      auVar14[4] = -(pcVar1[4] == cVar19);
      auVar14[5] = -(pcVar1[5] == cVar20);
      auVar14[6] = -(pcVar1[6] == cVar21);
      auVar14[7] = -(pcVar1[7] == cVar22);
      auVar14[8] = -(pcVar1[8] == cVar23);
      auVar14[9] = -(pcVar1[9] == cVar24);
      auVar14[10] = -(pcVar1[10] == cVar25);
      auVar14[0xb] = -(pcVar1[0xb] == cVar26);
      auVar14[0xc] = -(pcVar1[0xc] == cVar27);
      auVar14[0xd] = -(pcVar1[0xd] == cVar28);
      auVar14[0xe] = -(pcVar1[0xe] == cVar29);
      auVar14[0xf] = -(pcVar1[0xf] == cVar30);
      uVar10 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      if (uVar10 != 0) {
        lVar8 = *(long *)&(this->rvalues).field_0x148 + uVar7 * 0x438;
        do {
          uVar4 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
            }
          }
          if (*(ValueSymbol **)(lVar8 + (ulong)uVar4 * 0x48) == symbol) {
            lVar8 = lVar8 + (ulong)uVar4 * 0x48;
            goto LAB_006319b7;
          }
          uVar10 = uVar10 - 1 & uVar10;
        } while (uVar10 != 0);
      }
      if ((*(byte *)(uVar7 * 0x10 + lVar9 + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7]) == 0) break;
      lVar8 = uVar7 + uVar11;
      uVar11 = uVar11 + 1;
      uVar7 = lVar8 + 1U & uVar2;
    } while (uVar11 <= uVar2);
    lVar8 = 0;
LAB_006319b7:
    if (lVar8 == 0) {
      bVar6 = false;
    }
    else {
      IntervalMap<unsigned_long,_std::monostate,_3U>::find
                ((overlap_iterator *)&local_80,
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)(lVar8 + 8),
                 local_f0._M_value.first,local_f0._M_value.second);
      IntervalMap<unsigned_long,_std::monostate,_3U>::end
                ((const_iterator *)&local_c0,
                 (IntervalMap<unsigned_long,_std::monostate,_3U> *)(lVar8 + 8));
      bVar6 = IntervalMapDetails::Path::operator==
                        (&local_80.super_iterator.super_const_iterator.path,&local_c0.path);
      bVar6 = !bVar6;
      if (local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)local_c0.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
                   firstElement) {
        operator_delete(local_c0.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
      if (local_80.super_iterator.super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
          (pointer)((long)&local_80.super_iterator.super_const_iterator.path.path.
                           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry> + 0x18U)) {
        operator_delete(local_80.super_iterator.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
      }
    }
  }
  return bVar6;
}

Assistant:

bool DataFlowAnalysis::isReferenced(const ValueSymbol& symbol, const Expression& lsp) const {
    auto bounds = ValueDriver::getBounds(lsp, getEvalContext(), symbol.getType());
    if (!bounds)
        return isReferenced(symbol);

    {
        auto it = symbolToSlot.find(&symbol);
        if (it != symbolToSlot.end()) {
            auto& symbolState = lvalues[it->second];
            if (symbolState.assigned.find(*bounds) != symbolState.assigned.end())
                return true;
        }
    }
    {
        auto it = rvalues.find(&symbol);
        if (it != rvalues.end() && it->second.find(*bounds) != it->second.end())
            return true;
    }

    return false;
}